

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void rrot8(void *blob,int len,int c)

{
  undefined1 uVar1;
  char cVar2;
  sbyte sVar3;
  undefined1 local_3b;
  uint8_t b_1;
  uint8_t a;
  int i_1;
  uint8_t t;
  int i;
  uint8_t t_1;
  int j;
  int b;
  uint8_t *k;
  int nbytes;
  int c_local;
  int len_local;
  void *blob_local;
  
  if (c != 0) {
    for (j = 0; j < c / 8; j = j + 1) {
      uVar1 = *blob;
      for (i = 0; i < len + -1; i = i + 1) {
        *(undefined1 *)((long)blob + (long)i) = *(undefined1 *)((long)blob + (long)(i + 1));
      }
      *(undefined1 *)((long)blob + (long)(len + -1)) = uVar1;
    }
    if ((c & 7U) != 0) {
      cVar2 = *blob;
      for (i_1 = 0; i_1 < len; i_1 = i_1 + 1) {
        local_3b = cVar2;
        if (i_1 != len + -1) {
          local_3b = *(char *)((long)blob + (long)(i_1 + 1));
        }
        sVar3 = (sbyte)(c & 7U);
        *(byte *)((long)blob + (long)i_1) =
             local_3b << (8U - sVar3 & 0x1f) |
             (byte)((int)(uint)*(byte *)((long)blob + (long)i_1) >> sVar3);
      }
    }
  }
  return;
}

Assistant:

void rrot8 ( void * blob, int len, int c )
{
  int nbytes  = len;

  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 8;
  c &= (8-1);

  for(int j = 0; j < b; j++)
  {
    uint8_t t = k[0];

    for(int i = 0; i < nbytes-1; i++)
    {
      k[i] = k[i+1];
    }

    k[nbytes-1] = t;
  }

  if(c == 0) return;

  //----------

  uint8_t t = k[0];

  for(int i = 0; i < nbytes; i++)
  {
    uint8_t a = (i == nbytes-1) ? t : k[i+1];
    uint8_t b = k[i];

    k[i] = (a << (8-c)) | (b >> c);
  }
}